

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O0

int parse_cmdline_decoder(int argc,char **argv,opj_dparameters_t *parameters,img_fol_t *img_fol)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *infile;
  char optlist [9];
  opj_option_t long_option [1];
  int c;
  int totlen;
  img_fol_t *img_fol_local;
  opj_dparameters_t *parameters_local;
  char **argv_local;
  int argc_local;
  
  optlist._1_8_ = anon_var_dwarf_e2;
  stack0xffffffffffffff9f = 0x76683a663a6f3a69;
  optlist[0] = '\0';
  img_fol->set_out_format = '\0';
  do {
    iVar1 = opj_getopt_long(argc,argv,(char *)((long)&infile + 7),(opj_option_t *)(optlist + 1),0x20
                           );
    pcVar4 = opj_optarg;
    if (iVar1 == -1) break;
    switch(iVar1) {
    case 0x66:
      iVar2 = atoi(opj_optarg);
      img_fol->flag = iVar2;
      break;
    default:
      fprintf(_stderr,"[WARNING] An invalid option has been ignored.\n");
      break;
    case 0x68:
      decode_help_display();
      return 1;
    case 0x69:
      iVar2 = infile_format(opj_optarg);
      parameters->decod_format = iVar2;
      iVar2 = parameters->decod_format;
      if (((iVar2 != 0) && (iVar2 != 1)) && (iVar2 != 2)) {
        fprintf(_stderr,
                "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
                ,pcVar4);
        return 1;
      }
      iVar2 = opj_strcpy_s(parameters->infile,0x1000,pcVar4);
      if (iVar2 != 0) {
        fprintf(_stderr,"[ERROR] Path is too long\n");
        return 1;
      }
      break;
    case 0x6f:
      iVar2 = opj_strcpy_s(parameters->outfile,0x1000,opj_optarg);
      if (iVar2 != 0) {
        fprintf(_stderr,"[ERROR] Path is too long\n");
        return 1;
      }
      break;
    case 0x76:
      parameters->m_verbose = 1;
      break;
    case 0x79:
      sVar3 = strlen(opj_optarg);
      pcVar4 = (char *)malloc(sVar3 + 1);
      img_fol->imgdirpath = pcVar4;
      if (img_fol->imgdirpath == (char *)0x0) {
        return 1;
      }
      strcpy(img_fol->imgdirpath,opj_optarg);
      img_fol->set_imgdir = '\x01';
    }
  } while (iVar1 != -1);
  if (img_fol->set_imgdir == '\x01') {
    if (parameters->infile[0] != '\0') {
      fprintf(_stderr,"[ERROR] options -ImgDir and -i cannot be used together.\n");
      return 1;
    }
    if (img_fol->set_out_format == '\0') {
      fprintf(_stderr,"[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n");
      fprintf(_stderr,
              "Only one format allowed.\nValid format are PGM, PPM, PNM, PGX, BMP, TIF, RAW and TGA.\n"
             );
      return 1;
    }
    if (parameters->outfile[0] != '\0') {
      fprintf(_stderr,"[ERROR] options -ImgDir and -o cannot be used together\n");
      return 1;
    }
  }
  else if (parameters->infile[0] == '\0') {
    fprintf(_stderr,"[ERROR] Required parameter is missing\n");
    fprintf(_stderr,"Example: %s -i image.j2k\n",*argv);
    fprintf(_stderr,"   Help: %s -h\n",*argv);
    return 1;
  }
  return 0;
}

Assistant:

static int parse_cmdline_decoder(int argc, char **argv,
                                 opj_dparameters_t *parameters, img_fol_t *img_fol)
{
    int totlen, c;
    opj_option_t long_option[] = {
        {"ImgDir", REQ_ARG, NULL, 'y'}
    };
    const char optlist[] = "i:o:f:hv";

    totlen = sizeof(long_option);
    img_fol->set_out_format = 0;
    do {
        c = opj_getopt_long(argc, argv, optlist, long_option, totlen);
        if (c == -1) {
            break;
        }
        switch (c) {
        case 'i': {         /* input file */
            char *infile = opj_optarg;
            parameters->decod_format = infile_format(infile);
            switch (parameters->decod_format) {
            case J2K_CFMT:
                break;
            case JP2_CFMT:
                break;
            case JPT_CFMT:
                break;
            default:
                fprintf(stderr,
                        "[ERROR] Unknown input file format: %s \n"
                        "        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n",
                        infile);
                return 1;
            }
            if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile), infile) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ------------------------------------------------------ */

        case 'o': {   /* output file */
            if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                             opj_optarg) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */
        case 'f':             /* flag */
            img_fol->flag = atoi(opj_optarg);
            break;
        /* ----------------------------------------------------- */

        case 'h':           /* display an help description */
            decode_help_display();
            return 1;

        /* ------------------------------------------------------ */

        case 'y': {         /* Image Directory path */
            img_fol->imgdirpath = (char*)malloc(strlen(opj_optarg) + 1);
            if (img_fol->imgdirpath == NULL) {
                return 1;
            }
            strcpy(img_fol->imgdirpath, opj_optarg);
            img_fol->set_imgdir = 1;
        }
        break;

        /* ----------------------------------------------------- */

        case 'v': {         /* Verbose mode */
            parameters->m_verbose = 1;
        }
        break;

        /* ----------------------------------------------------- */
        default:
            fprintf(stderr, "[WARNING] An invalid option has been ignored.\n");
            break;
        }
    } while (c != -1);

    /* check for possible errors */
    if (img_fol->set_imgdir == 1) {
        if (!(parameters->infile[0] == 0)) {
            fprintf(stderr, "[ERROR] options -ImgDir and -i cannot be used together.\n");
            return 1;
        }
        if (img_fol->set_out_format == 0) {
            fprintf(stderr,
                    "[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n");
            fprintf(stderr, "Only one format allowed.\n"
                    "Valid format are PGM, PPM, PNM, PGX, BMP, TIF, RAW and TGA.\n");
            return 1;
        }
        if (!(parameters->outfile[0] == 0)) {
            fprintf(stderr, "[ERROR] options -ImgDir and -o cannot be used together\n");
            return 1;
        }
    } else {
        if (parameters->infile[0] == 0) {
            fprintf(stderr, "[ERROR] Required parameter is missing\n");
            fprintf(stderr, "Example: %s -i image.j2k\n", argv[0]);
            fprintf(stderr, "   Help: %s -h\n", argv[0]);
            return 1;
        }
    }

    return 0;
}